

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

iterator __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
erase(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,const_iterator position)

{
  Rep *pRVar1;
  void **ppvVar2;
  ulong uVar3;
  int start;
  
  pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
  ppvVar2 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar2 = (void **)0x0;
  }
  uVar3 = (long)position.it_ - (long)ppvVar2;
  start = (int)(uVar3 >> 3);
  DeleteSubrange(this,start,(int)(uVar3 + 8 >> 3) - start);
  pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
  ppvVar2 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar2 = (void **)0x0;
  }
  return (iterator)(void **)(((long)(uVar3 * 0x20000000) >> 0x1d) + (long)ppvVar2);
}

Assistant:

inline typename RepeatedPtrField<Element>::iterator
RepeatedPtrField<Element>::erase(const_iterator position) {
  return erase(position, position + 1);
}